

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O3

Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> __thiscall
capnp::CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
          (CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *this,Client *client)

{
  PromiseArenaMember *node;
  void *continuationTracePtr;
  anon_class_1_0_00000001_for_func local_21;
  PromiseArenaMember *local_20;
  code *local_18;
  
  capnp::_::CapabilityServerSetBase::getLocalServerInternal
            ((CapabilityServerSetBase *)&local_20,(Client *)client);
  local_18 = kj::_::
             SimpleTransformPromiseNode<void_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.h:1311:13)>
             ::anon_class_1_0_00000001_for_func::operator();
  kj::_::PromiseDisposer::
  appendPromise<kj::_::SimpleTransformPromiseNode<void*,capnp::CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer(capnproto_test::capnp::test::TestInterface::Client&)::_lambda(void*)_1_>,kj::_::PromiseDisposer,capnp::CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer(capnproto_test::capnp::test::TestInterface::Client&)::_lambda(void*)_1_,void*&>
            ((PromiseDisposer *)this,(OwnPromiseNode *)&local_20,&local_21,&local_18);
  node = local_20;
  if (local_20 != (PromiseArenaMember *)0x0) {
    local_20 = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<typename T::Server&>> CapabilityServerSet<T>::getLocalServer(
    typename T::Client& client) {
  return getLocalServerInternal(client)
      .then([](void* server) -> kj::Maybe<typename T::Server&> {
    if (server == nullptr) {
      return kj::none;
    } else {
      return *reinterpret_cast<typename T::Server*>(server);
    }
  });
}